

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

ssize_t __thiscall session::send(session *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  char head_data [16];
  iovec iov [2];
  
  iVar1 = encode_head(head_data,0x10,(int)__buf);
  iov[0].iov_len = (size_t)iVar1;
  iov[1].iov_len = (size_t)(int)__buf;
  iov[0].iov_base = head_data;
  iov[1].iov_base = (void *)CONCAT44(in_register_00000034,__fd);
  transmit(this,iov,2);
  return extraout_RAX;
}

Assistant:

void session::send(const void* data, int len)
{
    char head_data[16];
    int head_len = encode_head(head_data, sizeof(head_data), len);
    iovec iov[2];
    iov[0].iov_base = head_data;
    iov[0].iov_len = head_len;
    iov[1].iov_base = (char*)data;
    iov[1].iov_len = len;
    transmit(iov, 2);
}